

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::CommandRunner::ReadInvalidModule
          (CommandRunner *this,int line_number,string_view module_filename,ModuleType module_type,
          char *desc)

{
  string_view module_filename_00;
  string_view module_filename_01;
  bool bVar1;
  undefined8 uVar2;
  undefined1 local_a0 [8];
  Ptr module;
  Errors errors;
  undefined1 local_58 [8];
  string header;
  char *desc_local;
  ModuleType module_type_local;
  int line_number_local;
  CommandRunner *this_local;
  string_view module_filename_local;
  
  module_filename_local._M_len = (size_t)module_filename._M_str;
  header.field_2._8_8_ = desc;
  uVar2 = std::__cxx11::string::c_str();
  wabt::StringPrintf_abi_cxx11_
            ((string *)local_58,"%s:%d: %s passed",uVar2,(ulong)(uint)line_number,
             header.field_2._8_8_);
  if (module_type == Text) {
    module_filename_01._M_str = (char *)module_filename_local._M_len;
    module_filename_01._M_len = module_filename._M_len;
    module_filename_local._M_str._4_4_ =
         ReadTextModule(this,module_filename_01,(string *)local_58,true);
  }
  else {
    if (module_type != Binary) {
      abort();
    }
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&module.root_index_);
    module_filename_00._M_str = (char *)module_filename_local._M_len;
    module_filename_00._M_len = module_filename._M_len;
    ReadModule((Ptr *)local_a0,this,module_filename_00,(Errors *)&module.root_index_);
    bVar1 = wabt::interp::RefPtr::operator_cast_to_bool((RefPtr *)local_a0);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&module_filename_local._M_str + 4),Ok);
    }
    else {
      wabt::FormatErrorsToFile
                ((Errors *)&module.root_index_,Binary,(LexerSourceLineFinder *)0x0,_stdout,
                 (string *)local_58,Once,0x50);
      wabt::Result::Result((Result *)((long)&module_filename_local._M_str + 4),Error);
    }
    wabt::interp::RefPtr<wabt::interp::Module>::~RefPtr((RefPtr<wabt::interp::Module> *)local_a0);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&module.root_index_);
  }
  std::__cxx11::string::~string((string *)local_58);
  return (Result)module_filename_local._M_str._4_4_;
}

Assistant:

wabt::Result CommandRunner::ReadInvalidModule(int line_number,
                                              std::string_view module_filename,
                                              ModuleType module_type,
                                              const char* desc) {
  std::string header = StringPrintf(
      "%s:%d: %s passed", source_filename_.c_str(), line_number, desc);

  switch (module_type) {
    case ModuleType::Text: {
      return ReadTextModule(module_filename, header, true);
    }

    case ModuleType::Binary: {
      Errors errors;
      auto module = ReadModule(module_filename, &errors);
      if (!module) {
        FormatErrorsToFile(errors, Location::Type::Binary, {}, stdout, header,
                           PrintHeader::Once);
        return wabt::Result::Error;
      } else {
        return wabt::Result::Ok;
      }
    }
  }

  WABT_UNREACHABLE;
}